

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perceptual_linear_predictive_coefficients_analysis.h
# Opt level: O0

void __thiscall
sptk::PerceptualLinearPredictiveCoefficientsAnalysis::
~PerceptualLinearPredictiveCoefficientsAnalysis
          (PerceptualLinearPredictiveCoefficientsAnalysis *this)

{
  MelFilterBankAnalysis *in_RDI;
  vector<double,_std::allocator<double>_> *unaff_retaddr;
  
  in_RDI->_vptr_MelFilterBankAnalysis =
       (_func_int **)&PTR__PerceptualLinearPredictiveCoefficientsAnalysis_001395c0;
  std::vector<double,_std::allocator<double>_>::~vector(unaff_retaddr);
  std::vector<double,_std::allocator<double>_>::~vector(unaff_retaddr);
  LinearPredictiveCoefficientsToCepstrum::~LinearPredictiveCoefficientsToCepstrum
            ((LinearPredictiveCoefficientsToCepstrum *)
             &in_RDI[1].center_frequencies_.super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  LevinsonDurbinRecursion::~LevinsonDurbinRecursion
            ((LevinsonDurbinRecursion *)&in_RDI[1].center_frequencies_);
  InverseFourierTransform::~InverseFourierTransform((InverseFourierTransform *)in_RDI);
  MelFilterBankAnalysis::~MelFilterBankAnalysis(in_RDI);
  return;
}

Assistant:

virtual ~PerceptualLinearPredictiveCoefficientsAnalysis() {
  }